

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_string_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required)

{
  int iVar1;
  uint in_register_00000004;
  flatbuffers_uoffset_t base;
  uint local_14;
  
  local_14 = in_register_00000004;
  iVar1 = get_offset_field(td,id,required,&local_14);
  if (local_14 != 0 && iVar1 == 0) {
    iVar1 = verify_string(td->buf,td->end,local_14,
                          *(flatbuffers_uoffset_t *)((long)td->buf + (ulong)local_14));
    return iVar1;
  }
  return iVar1;
}

Assistant:

int flatcc_verify_string_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_string(td->buf, td->end, base, read_uoffset(td->buf, base));
}